

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeLDRPreReg(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar3;
  
  uVar3 = Insn >> 0x10 & 0xf;
  Decoder_00 = (void *)0x1;
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[Insn >> 0xc & 0xf]);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar3]);
  DVar2 = DecodeSORegMemOperand
                    (Inst,Insn >> 0xb & 0x1000 | uVar3 << 0xd | Insn & 0xfff,Address_00,Decoder_00);
  if (DVar2 == MCDisassembler_Fail) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
      bVar1 = false;
    }
  }
  if (bVar1) {
    DVar2 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,Decoder_00);
    DVar2 = (*(code *)(&DAT_001d469c + *(int *)(&DAT_001d469c + (ulong)DVar2 * 4)))();
    return DVar2;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeLDRPreReg(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred, Rm;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;
	if (Rm == 0xF) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSORegMemOperand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}